

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

uint __thiscall LinearScan::GetSpillCost(LinearScan *this,Lifetime *lifetime)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  uVar4 = Lifetime::GetRegionUseCount(lifetime,this->curLoop);
  uVar13 = this->loopNest;
  uVar8 = uVar13 * 0x8000 - 0x28000;
  if (uVar13 < 6) {
    uVar8 = 1 << ((char)uVar13 * '\x03' & 0x1fU);
  }
  if ((lifetime->reg != RegNOREG) && ((lifetime->field_0x9c & 1) == 0)) {
    uVar13 = lifetime->allDefsCost;
    if (uVar8 < lifetime->allDefsCost) {
      uVar13 = uVar8;
    }
    uVar4 = uVar4 + uVar13;
    if (this->curLoop != (Loop *)0x0) {
      bVar2 = StackSym::IsConst(lifetime->sym);
      if (!bVar2) {
        BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                           (lifetime->sym->super_Sym).m_id);
        if (BVar3 == '\0') {
          uVar8 = 0;
        }
        uVar4 = uVar4 + uVar8;
      }
    }
  }
  uVar5 = IR::Instr::GetNumber(this->currentInstr);
  uVar13 = lifetime->end;
  if (lifetime->end < uVar5) {
    uVar13 = uVar5;
  }
  uVar11 = lifetime->totalOpHelperLengthByEnd;
  if ((this->curLoop != (Loop *)0x0) && ((this->curLoop->regAlloc).loopEnd < uVar13)) {
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,RegionUseCountPhase,uVar6,uVar7);
    if (!bVar2) {
      uVar13 = (this->curLoop->regAlloc).loopEnd;
      uVar11 = (this->curLoop->regAlloc).helperLength;
    }
  }
  uVar6 = this->totalOpHelperFullVisitedLength;
  uVar7 = CurrentOpHelperVisitedLength(this,this->currentInstr);
  uVar8 = uVar7 + uVar6;
  uVar12 = uVar11 - uVar8;
  if (uVar11 < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdfd,
                       "(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength)",
                       "lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength");
    if (!bVar2) goto LAB_005367a9;
    *puVar9 = 0;
  }
  uVar8 = (uVar13 - uVar5) + 1;
  if (uVar8 < uVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdff,"(length >= lifetimeHelperLength)","length >= lifetimeHelperLength");
    if (!bVar2) {
LAB_005367a9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  uVar10 = 0x41;
  if (uVar8 != uVar12) {
    uVar10 = (ulong)(((uVar13 - uVar5) - uVar12) + 0x41);
  }
  uVar13 = (uint)((uVar4 << 0xd) / uVar10);
  if ((*(ushort *)&lifetime->field_0x9c >> 9 & 1) != 0) {
    uVar13 = (uVar13 << 2) / 5;
  }
  uVar13 = uVar13 >> ((byte)(*(ushort *)&lifetime->field_0x9c >> 10) & 1);
  bVar2 = StackSym::IsConst(lifetime->sym);
  uVar11 = uVar13 >> 4;
  if (!bVar2) {
    uVar11 = uVar13;
  }
  return uVar11;
}

Assistant:

uint
LinearScan::GetSpillCost(Lifetime *lifetime)
{
    uint useCount = lifetime->GetRegionUseCount(this->curLoop);
    uint spillCost;
    // Get local spill cost.  Ignore helper blocks as we'll also need compensation on the main path.
    uint localUseCost = LinearScan::GetUseSpillCost(this->loopNest, false);

    if (lifetime->reg && !lifetime->isSpilled)
    {
        // If it is in a reg, we'll need a store
        if (localUseCost >= lifetime->allDefsCost)
        {
            useCount += lifetime->allDefsCost;
        }
        else
        {
            useCount += localUseCost;
        }

        if (this->curLoop && !lifetime->sym->IsConst()
            && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
        {
            // If we spill here, we'll need to insert a load at the bottom of the loop
            // (it would be nice to be able to check is was in a reg at the top of the loop)...
            useCount += localUseCost;
        }
    }

    // When comparing 2 lifetimes, we don't really care about the actual length of the lifetimes.
    // What matters is how much longer will they use the register.
    const uint start = currentInstr->GetNumber();
    uint end = max(start, lifetime->end);
    uint lifetimeTotalOpHelperFullVisitedLength = lifetime->totalOpHelperLengthByEnd;

    if (this->curLoop && this->curLoop->regAlloc.loopEnd < end && !PHASE_OFF(Js::RegionUseCountPhase, this->func))
    {
        end = this->curLoop->regAlloc.loopEnd;
        lifetimeTotalOpHelperFullVisitedLength  = this->curLoop->regAlloc.helperLength;
    }
    uint length = end - start + 1;

    // Exclude helper block length since helper block paths are typically infrequently taken paths and not as important
    const uint totalOpHelperVisitedLength = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);
    Assert(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength);
    const uint lifetimeHelperLength = lifetimeTotalOpHelperFullVisitedLength - totalOpHelperVisitedLength;
    Assert(length >= lifetimeHelperLength);
    length -= lifetimeHelperLength;
    if(length == 0)
    {
        length = 1;
    }

    // Add a base length so that the difference between a length of 1 and a length of 2 is not so large
#ifdef _M_X64
    length += 64;
#else
    length += 16;
#endif

    spillCost = (useCount << 13) / length;

    if (lifetime->isSecondChanceAllocated)
    {
        // Second chance allocation have additional overhead, so de-prioritize them
        // Note: could use more tuning...
        spillCost = spillCost * 4/5;
    }
    if (lifetime->isCheapSpill)
    {
        // This lifetime will get spilled eventually, so lower the spill cost to favor other lifetimes
        // Note: could use more tuning...
        spillCost /= 2;
    }

    if (lifetime->sym->IsConst())
    {
        spillCost = spillCost / 16;
    }

    return spillCost;
}